

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

bool __thiscall FPolyObj::CheckMobjBlocking(FPolyObj *this,side_t *sd)

{
  AActor *thing;
  int iVar1;
  uint uVar2;
  AActor **ppAVar3;
  secplane_t *psVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  DVector3 local_1a8;
  TVector2<double> local_190;
  int local_17c;
  undefined1 local_178 [4];
  int side;
  TVector2<double> local_160;
  undefined1 local_150 [8];
  FBoundingBox box;
  undefined1 local_118 [8];
  DVector2 pos;
  undefined1 local_100 [8];
  FLineOpening open;
  TFlags<ActorFlag,_unsigned_int> local_68;
  bool local_62;
  byte local_61;
  bool performBlockingThrust;
  line_t_conflict *plStack_60;
  bool blocked;
  line_t_conflict *ld;
  int local_50;
  int bottom;
  int top;
  int right;
  int left;
  int k;
  int j;
  int i;
  AActor *mobj;
  FBlockNode *block;
  side_t *local_18;
  side_t *sd_local;
  FPolyObj *this_local;
  
  local_18 = sd;
  sd_local = (side_t *)this;
  if ((CheckMobjBlocking(side_t*)::checker == '\0') &&
     (iVar1 = __cxa_guard_acquire(&CheckMobjBlocking(side_t*)::checker), iVar1 != 0)) {
    TArray<AActor_*,_AActor_*>::TArray(&CheckMobjBlocking::checker);
    __cxa_atexit(TArray<AActor_*,_AActor_*>::~TArray,&CheckMobjBlocking::checker,&__dso_handle);
    __cxa_guard_release(&CheckMobjBlocking(side_t*)::checker);
  }
  plStack_60 = local_18->linedef;
  local_50 = GetBlockY(plStack_60->bbox[0]);
  ld._4_4_ = GetBlockY(plStack_60->bbox[1]);
  top = GetBlockX(plStack_60->bbox[2]);
  bottom = GetBlockX(plStack_60->bbox[3]);
  local_61 = 0;
  TArray<AActor_*,_AActor_*>::Clear(&CheckMobjBlocking::checker);
  if (ld._4_4_ < 0) {
    local_1b4 = 0;
  }
  else {
    local_1b4 = ld._4_4_;
  }
  if (local_1b4 < bmapheight) {
    local_1b8 = local_1b4;
  }
  else {
    local_1b8 = bmapheight + -1;
  }
  ld._4_4_ = local_1b8;
  if (local_50 < 0) {
    local_1bc = 0;
  }
  else {
    local_1bc = local_50;
  }
  if (local_1bc < bmapheight) {
    local_1c0 = local_1bc;
  }
  else {
    local_1c0 = bmapheight + -1;
  }
  local_50 = local_1c0;
  if (top < 0) {
    local_1c4 = 0;
  }
  else {
    local_1c4 = top;
  }
  if (local_1c4 < bmapwidth) {
    local_1c8 = local_1c4;
  }
  else {
    local_1c8 = bmapwidth + -1;
  }
  top = local_1c8;
  if (bottom < 0) {
    local_1cc = 0;
  }
  else {
    local_1cc = bottom;
  }
  if (local_1cc < bmapwidth) {
    local_1d0 = local_1cc;
  }
  else {
    local_1d0 = bmapwidth + -1;
  }
  bottom = local_1d0;
  left = local_1b8 * bmapwidth;
  do {
    if (local_50 * bmapwidth < left) {
      return (bool)(local_61 & 1);
    }
    for (k = top; k <= bottom; k = k + 1) {
      for (mobj = (AActor *)blocklinks[left + k]; mobj != (AActor *)0x0;
          mobj = (AActor *)(mobj->super_DThinker).super_DObject.GCNext) {
        _j = (AActor *)(mobj->super_DThinker).super_DObject._vptr_DObject;
        right = TArray<AActor_*,_AActor_*>::Size(&CheckMobjBlocking::checker);
        do {
          right = right - 1;
          if (right < 0) break;
          ppAVar3 = TArray<AActor_*,_AActor_*>::operator[](&CheckMobjBlocking::checker,(long)right);
        } while (*ppAVar3 != _j);
        if (right < 0) {
          TArray<AActor_*,_AActor_*>::Push(&CheckMobjBlocking::checker,(AActor **)&j);
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_68,
                     (int)_j + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                               MF_SHOOTABLE));
          uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_68);
          bVar5 = false;
          if (uVar2 != 0) {
            TFlags<ActorFlag,_unsigned_int>::operator&
                      ((TFlags<ActorFlag,_unsigned_int> *)&open.touchmidtex,
                       (int)_j + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|
                                  MF_NOSECTOR|MF_SHOOTABLE));
            uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&open.touchmidtex);
            bVar5 = uVar2 == 0;
          }
          if (bVar5) {
            FLineOpening::FLineOpening((FLineOpening *)local_100);
            local_100 = (undefined1  [8])0x47efffffe0000000;
            open.top = -3.4028234663852886e+38;
            bVar5 = false;
            if (((plStack_60->backsector != (sector_t_conflict *)0x0) &&
                (bVar5 = false, (plStack_60->flags & 0x8001) == 0)) &&
               (((plStack_60->flags & 0x4000) == 0 || (bVar5 = false, _j->player == (player_t *)0x0)
                ))) {
              if ((plStack_60->flags & 2) != 0) {
                TFlags<ActorFlag3,_unsigned_int>::operator&
                          ((TFlags<ActorFlag3,_unsigned_int> *)((long)&pos.Y + 4),
                           (int)_j + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|
                                     MF3_NORADIUSDMG));
                uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&pos.Y + 4));
                bVar5 = false;
                if (uVar2 != 0) goto LAB_0062c787;
              }
              TFlags<ActorFlag,_unsigned_int>::operator&
                        ((TFlags<ActorFlag,_unsigned_int> *)&pos.Y,
                         (int)_j + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|
                                    MF_NOSECTOR|MF_SHOOTABLE));
              uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&pos.Y);
              if (((uVar2 == 0) || (bVar5 = false, (plStack_60->flags & 0x40000) == 0)) &&
                 (bVar5 = true, (plStack_60->flags & 0x200000) != 0)) {
                bVar5 = P_LineOpening_3dMidtex(_j,plStack_60,(FLineOpening *)local_100,false);
                if (!bVar5) {
                  dVar6 = AActor::Top(_j);
                  bVar5 = true;
                  if (dVar6 < (double)local_100) goto LAB_0062c787;
                }
                bVar5 = false;
                if ((open.backfloorplane.negiC._5_1_ & 1) != 0) {
                  dVar6 = AActor::Z(_j);
                  bVar5 = _j->floorz <= dVar6 && dVar6 != _j->floorz;
                }
              }
            }
LAB_0062c787:
            local_62 = !bVar5;
            AActor::PosRelative((DVector3 *)(box.m_Box + 3),_j,plStack_60);
            TVector2<double>::TVector2
                      ((TVector2<double> *)local_118,(TVector3<double> *)(box.m_Box + 3));
            FBoundingBox::FBoundingBox((FBoundingBox *)local_150,(double)local_118,pos.X,_j->radius)
            ;
            bVar5 = FBoundingBox::inRange((FBoundingBox *)local_150,plStack_60);
            if ((bVar5) &&
               (iVar1 = FBoundingBox::BoxOnLineSide((FBoundingBox *)local_150,(line_t *)plStack_60),
               iVar1 == -1)) {
              bVar5 = line_t::isLinePortal((line_t *)plStack_60);
              thing = _j;
              if (bVar5) {
                AActor::Pos((DVector3 *)local_178,_j);
                TVector2<double>::TVector2(&local_160,(TVector3<double> *)local_178);
                bVar5 = P_TryMove(thing,&local_160,0,(secplane_t *)0x0);
                if (bVar5) goto LAB_0062c9c4;
              }
              if (plStack_60->sidedef[1] != (side_t *)0x0) {
                AActor::Pos(&local_1a8,_j);
                TVector2<double>::TVector2(&local_190,&local_1a8);
                local_17c = P_PointOnLineSidePrecise(&local_190,plStack_60);
                if (plStack_60->sidedef[local_17c] != local_18) goto LAB_0062c9c4;
                if ((local_62 & 1U) == 0) {
                  dVar6 = AActor::Z(_j);
                  psVar4 = sector_t::GetSecPlane
                                     ((sector_t *)
                                      plStack_60->sidedef[(local_17c != 0 ^ 0xffU) & 1]->sector,0);
                  dVar7 = secplane_t::ZatPoint(psVar4,_j);
                  if (dVar7 <= dVar6) {
                    dVar6 = AActor::Top(_j);
                    psVar4 = sector_t::GetSecPlane
                                       ((sector_t *)
                                        plStack_60->sidedef[(local_17c != 0 ^ 0xffU) & 1]->sector,1)
                    ;
                    dVar7 = secplane_t::ZatPoint(psVar4,_j);
                    if (dVar6 <= dVar7) goto LAB_0062c99c;
                  }
                  local_62 = true;
                }
              }
LAB_0062c99c:
              if ((local_62 & 1U) != 0) {
                ThrustMobj(this,_j,local_18);
                local_61 = 1;
              }
            }
          }
        }
LAB_0062c9c4:
      }
    }
    left = bmapwidth + left;
  } while( true );
}

Assistant:

bool FPolyObj::CheckMobjBlocking (side_t *sd)
{
	static TArray<AActor *> checker;
	FBlockNode *block;
	AActor *mobj;
	int i, j, k;
	int left, right, top, bottom;
	line_t *ld;
	bool blocked;
	bool performBlockingThrust;

	ld = sd->linedef;

	top = GetBlockY(ld->bbox[BOXTOP]);
	bottom = GetBlockY(ld->bbox[BOXBOTTOM]);
	left = GetBlockX(ld->bbox[BOXLEFT]);
	right = GetBlockX(ld->bbox[BOXRIGHT]);

	blocked = false;
	checker.Clear();

	bottom = bottom < 0 ? 0 : bottom;
	bottom = bottom >= bmapheight ? bmapheight-1 : bottom;
	top = top < 0 ? 0 : top;
	top = top >= bmapheight  ? bmapheight-1 : top;
	left = left < 0 ? 0 : left;
	left = left >= bmapwidth ? bmapwidth-1 : left;
	right = right < 0 ? 0 : right;
	right = right >= bmapwidth ?  bmapwidth-1 : right;

	for (j = bottom*bmapwidth; j <= top*bmapwidth; j += bmapwidth)
	{
		for (i = left; i <= right; i++)
		{
			for (block = blocklinks[j+i]; block != NULL; block = block->NextActor)
			{
				mobj = block->Me;
				for (k = (int)checker.Size()-1; k >= 0; --k)
				{
					if (checker[k] == mobj)
					{
						break;
					}
				}
				if (k < 0)
				{
					checker.Push (mobj);
					if ((mobj->flags&MF_SOLID) && !(mobj->flags&MF_NOCLIP))
					{
						FLineOpening open;
						open.top = LINEOPEN_MAX;
						open.bottom = LINEOPEN_MIN;
						// [TN] Check wether this actor gets blocked by the line.
						if (ld->backsector != NULL &&
							!(ld->flags & (ML_BLOCKING|ML_BLOCKEVERYTHING))
							&& !(ld->flags & ML_BLOCK_PLAYERS && mobj->player) 
							&& !(ld->flags & ML_BLOCKMONSTERS && mobj->flags3 & MF3_ISMONSTER)
							&& !((mobj->flags & MF_FLOAT) && (ld->flags & ML_BLOCK_FLOATERS))
							&& (!(ld->flags & ML_3DMIDTEX) ||
								(!P_LineOpening_3dMidtex(mobj, ld, open) &&
									(mobj->Top() < open.top)
								) || (open.abovemidtex && mobj->Z() > mobj->floorz))
							)
						{
							// [BL] We can't just continue here since we must
							// determine if the line's backsector is going to
							// be blocked.
							performBlockingThrust = false;
						}
						else
						{
							performBlockingThrust = true;
						}

						DVector2 pos = mobj->PosRelative(ld);
						FBoundingBox box(pos.X, pos.Y, mobj->radius);

						if (!box.inRange(ld) || box.BoxOnLineSide(ld) != -1)
						{
							continue;
						}

						if (ld->isLinePortal())
						{
							// Fixme: this still needs to figure out if the polyobject move made the player cross the portal line.
							if (P_TryMove(mobj, mobj->Pos(), false))
							{
								continue;
							}
						}
						// We have a two-sided linedef so we should only check one side
						// so that the thrust from both sides doesn't cancel each other out.
						// Best use the one facing the player and ignore the back side.
						if (ld->sidedef[1] != NULL)
						{
							int side = P_PointOnLineSidePrecise(mobj->Pos(), ld);
							if (ld->sidedef[side] != sd)
							{
								continue;
							}
							// [BL] See if we hit below the floor/ceiling of the poly.
							else if(!performBlockingThrust && (
									mobj->Z() < ld->sidedef[!side]->sector->GetSecPlane(sector_t::floor).ZatPoint(mobj) ||
									mobj->Top() > ld->sidedef[!side]->sector->GetSecPlane(sector_t::ceiling).ZatPoint(mobj)
								))
							{
								performBlockingThrust = true;
							}
						}

						if(performBlockingThrust)
						{
							ThrustMobj (mobj, sd);
							blocked = true;
						}
						else
							continue;
					}
				}
			}
		}
	}
	return blocked;
}